

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::basic_pbf_writer<protozero::fixed_size_buffer_adaptor>::add_packed_svarint<int_const*>
          (basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this,pbf_tag_type tag,int *first,
          int *last)

{
  uint64_t value;
  undefined1 local_48 [8];
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> sw;
  int *last_local;
  int *first_local;
  pbf_tag_type tag_local;
  basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *this_local;
  
  if (first != last) {
    sw.m_pos = (size_t)last;
    basic_pbf_writer((basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *)local_48,this,tag,0);
    last_local = first;
    while (last_local != (int *)sw.m_pos) {
      value = encode_zigzag64((long)*last_local);
      add_varint((basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *)local_48,value);
      last_local = last_local + 1;
    }
    ~basic_pbf_writer((basic_pbf_writer<protozero::fixed_size_buffer_adaptor> *)local_48);
  }
  return;
}

Assistant:

void add_packed_svarint(pbf_tag_type tag, It first, It last) { // NOLINT(performance-unnecessary-value-param)
        if (first == last) {
            return;
        }

        basic_pbf_writer sw{*this, tag};

        while (first != last) {
            sw.add_varint(encode_zigzag64(*first++));
        }
    }